

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iinq.c
# Opt level: O1

void iinq_test_create_query_select_all_from_where_single_dictionary(planck_unit_test_t *tc)

{
  long lVar1;
  ion_dictionary_handler_t *piVar2;
  _func_ion_err_t_ion_dictionary_id_t *p_Var3;
  code *pcVar4;
  ion_err_t iVar5;
  planck_unit_result_t pVar6;
  char cVar7;
  ion_status_t iVar8;
  ion_dictionary_handler_t **ppiVar9;
  int *piVar10;
  ion_dictionary_handler_t **ppiVar11;
  ion_dictionary_handler_t **ppiVar12;
  ion_dictionary_handler_t **ppiVar13;
  code *pcStack_120;
  int aiStack_118 [2];
  ion_dictionary_handler_t local_110;
  ion_dictionary_t local_c0;
  ion_predicate_t local_a8;
  ion_dict_cursor_t *local_88 [2];
  int *local_78;
  undefined1 *local_70;
  int *local_68;
  undefined1 *local_60;
  ion_dictionary_handler_t *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  piVar10 = aiStack_118;
  pcStack_120 = (code *)0x1016f4;
  iVar5 = iinq_create_source("test.inq",key_type_numeric_signed,4,4);
  pcStack_120 = (code *)0x10170d;
  pVar6 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar5,0xc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                    );
  if (pVar6 != '\0') {
    local_40 = 1;
    local_3c = 1;
    pcStack_120 = (code *)0x101732;
    iVar8 = iinq_insert("test.inq",&local_40,&local_3c);
    pcStack_120 = (code *)0x10174f;
    pVar6 = planck_unit_assert_int_are_equal
                      (tc,0,(int)iVar8.error,0xc6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                      );
    if (pVar6 != '\0') {
      pcStack_120 = (code *)0x10177d;
      pVar6 = planck_unit_assert_int_are_equal
                        (tc,1,iVar8.count,199,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                        );
      if (pVar6 != '\0') {
        local_38 = 1;
        local_34 = 1;
        pcStack_120 = (code *)0x10179f;
        iVar8 = iinq_insert("test.inq",&local_38,&local_34);
        pcStack_120 = (code *)0x1017bc;
        pVar6 = planck_unit_assert_int_are_equal
                          (tc,0,(int)iVar8.error,0xcd,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                          );
        if (pVar6 != '\0') {
          pcStack_120 = (code *)0x1017e4;
          pVar6 = planck_unit_assert_int_are_equal
                            (tc,1,iVar8.count,0xce,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                            );
          if (pVar6 != '\0') {
            local_c0.handler = &local_110;
            uStack_48 = 0;
            local_50 = 0;
            pcStack_120 = (code *)0x101829;
            local_58 = local_c0.handler;
            iVar5 = iinq_open_source("test.inq",&local_c0,local_c0.handler);
            if (iVar5 == '\0') {
              local_78 = (int *)((long)aiStack_118 -
                                ((long)((local_c0.instance)->record).key_size + 0xfU &
                                0xfffffffffffffff0));
              piVar10 = (int *)((long)local_78 -
                               ((long)((local_c0.instance)->record).value_size + 0xfU &
                               0xfffffffffffffff0));
              local_70 = (undefined1 *)piVar10;
              local_68 = local_78;
              local_60 = (undefined1 *)piVar10;
              *(undefined8 *)((long)piVar10 + -8) = 0x101885;
              iVar5 = dictionary_build_predicate(&local_a8,'\x02');
              if (iVar5 == '\0') {
                ppiVar13 = &local_58;
                *(undefined8 *)((long)piVar10 + -8) = 0x1018a0;
                dictionary_find(&local_c0,&local_a8,local_88);
                ppiVar11 = ppiVar13;
                ppiVar12 = ppiVar13;
                do {
                  while( true ) {
                    piVar2 = *ppiVar11;
                    p_Var3 = piVar2[1].destroy_dictionary;
                    pcVar4 = *(code **)(p_Var3 + 0x18);
                    *(undefined8 *)((long)piVar10 + -8) = 0x1018c8;
                    cVar7 = (*pcVar4)(p_Var3,&piVar2[2].create_dictionary);
                    piVar2 = *ppiVar11;
                    *(char *)&piVar2[1].open_dictionary = cVar7;
                    if ((cVar7 != '\x02') && (cVar7 != '\x04')) break;
                    if (ppiVar12 != ppiVar11) {
                      ppiVar11 = ppiVar13;
                    }
                    ppiVar9 = ppiVar13;
                    ppiVar12 = ppiVar11;
                    if (*local_78 == 1) {
                      do {
                        lVar1 = (long)(ppiVar9 + 1);
                        ppiVar9 = *(ion_dictionary_handler_t ***)lVar1;
                      } while (*(ion_dictionary_handler_t ***)lVar1 !=
                               (ion_dictionary_handler_t **)0x0);
                      *(undefined8 *)((long)piVar10 + -8) = 0x101960;
                      puts("In here, hello!");
                      *(undefined8 *)((long)piVar10 + -8) = 0x10196f;
                      fflush(_stdout);
                    }
                  }
                  pcVar4 = *(code **)(piVar2[1].destroy_dictionary + 0x20);
                  *(undefined8 *)((long)piVar10 + -8) = 0x1018eb;
                  (*pcVar4)(&piVar2[1].destroy_dictionary);
                  piVar2 = *ppiVar11;
                  *(undefined8 *)((long)piVar10 + -8) = 0x1018ff;
                  dictionary_find((ion_dictionary_t *)(piVar2 + 1),
                                  (ion_predicate_t *)&piVar2[1].update,
                                  (ion_dict_cursor_t **)&piVar2[1].destroy_dictionary);
                  piVar2 = *ppiVar11;
                  p_Var3 = piVar2[1].destroy_dictionary;
                  pcVar4 = *(code **)(p_Var3 + 0x18);
                  *(undefined8 *)((long)piVar10 + -8) = 0x101914;
                  cVar7 = (*pcVar4)(p_Var3,&piVar2[2].create_dictionary);
                  *(char *)&(*ppiVar11)[1].open_dictionary = cVar7;
                } while (((cVar7 == '\x04') || (cVar7 == '\x02')) &&
                        (lVar1 = (long)(ppiVar11 + 2),
                        ppiVar11 = *(ion_dictionary_handler_t ***)lVar1,
                        *(ion_dictionary_handler_t ***)lVar1 != (ion_dictionary_handler_t **)0x0));
                do {
                  piVar2 = *ppiVar13;
                  pcVar4 = *(code **)(*(_func_ion_err_t_ion_dictionary_id_t **)
                                       ((long)(piVar2 + 1) + 0x38) + 0x20);
                  *(undefined8 *)((long)piVar10 + -8) = 0x10198b;
                  (*pcVar4)((_func_ion_err_t_ion_dictionary_id_t **)((long)(piVar2 + 1) + 0x38));
                  piVar2 = *ppiVar13;
                  *(undefined8 *)((long)piVar10 + -8) = 0x101997;
                  ion_close_dictionary((ion_dictionary_t *)(piVar2 + 1));
                  ppiVar13 = (ion_dictionary_handler_t **)ppiVar13[1];
                } while (ppiVar13 != (ion_dictionary_handler_t **)0x0);
              }
            }
            *(undefined8 *)((long)piVar10 + -8) = 0x1019ac;
            iinq_drop("test.inq");
            return;
          }
        }
      }
    }
  }
  pcStack_120 = iinq_test_create_query_select_all_from_where_two_dictionaries;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
iinq_test_create_query_select_all_from_where_single_dictionary(
	planck_unit_test_t *tc
) {
	ion_err_t					error;
	ion_status_t				status;
	ion_iinq_query_processor_t	processor;

	ion_key_type_t		key_type;
	ion_key_size_t		key_size;
	ion_value_size_t	value_size;
	ion_key_t			key;
	ion_value_t			value;

	processor	= IINQ_QUERY_PROCESSOR(print_hello, NULL);

	key_type	= key_type_numeric_signed;
	key_size	= sizeof(int);
	value_size	= sizeof(int);

	error		= CREATE_DICTIONARY(test, key_type, key_size, value_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	key			= IONIZE(1, int);
	value		= IONIZE(1, int);

	status		= INSERT(test, key, value);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	key		= IONIZE(1, int);
	value	= IONIZE(1, int);

	status	= INSERT(test, key, value);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	QUERY(SELECT_ALL, FROM(test), WHERE(NEUTRALIZE(test.key, int) == 1), , , , , , &processor);

	DROP(test);
}